

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

void __thiscall
cs_impl::
cni_helper<void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&),void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&)>
::_call<0,1,2>(cni_helper<void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&),void(*)(std::shared_ptr<cs::context_type>const&,std::__cxx11::string_const&,cs_impl::any_const&)>
               *this,vector *args,sequence<0,_1,_2> *param_2)

{
  shared_ptr<cs::context_type> *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  psVar1 = try_convert_and_check<const_std::shared_ptr<cs::context_type>_&,_const_std::shared_ptr<cs::context_type>_&,_std::shared_ptr<cs::context_type>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  pbVar2 = try_convert_and_check<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start + 1);
  if (*(long *)(this + 0x10) != 0) {
    (**(code **)(this + 0x18))
              (this,psVar1,pbVar2,
               (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start + 2,*(code **)(this + 0x18));
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}